

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

int xmlDebugCheckDocument(FILE *output,xmlDocPtr doc)

{
  undefined1 local_b8 [8];
  xmlDebugCtxt ctxt;
  xmlDocPtr doc_local;
  FILE *output_local;
  
  doc_local = (xmlDocPtr)output;
  if (output == (FILE *)0x0) {
    doc_local = _stdout;
  }
  ctxt._152_8_ = doc;
  xmlCtxtDumpInitCtxt((xmlDebugCtxtPtr)local_b8);
  local_b8 = (undefined1  [8])doc_local;
  ctxt.dict._0_4_ = 1;
  xmlCtxtDumpDocument((xmlDebugCtxtPtr)local_b8,(xmlDocPtr)ctxt._152_8_);
  xmlCtxtDumpCleanCtxt((xmlDebugCtxtPtr)local_b8);
  return ctxt.dict._4_4_;
}

Assistant:

int
xmlDebugCheckDocument(FILE * output, xmlDocPtr doc)
{
    xmlDebugCtxt ctxt;

    if (output == NULL)
	output = stdout;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    ctxt.check = 1;
    xmlCtxtDumpDocument(&ctxt, doc);
    xmlCtxtDumpCleanCtxt(&ctxt);
    return(ctxt.errors);
}